

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

uint __thiscall CVmObjBigNum::calc_hash(CVmObjBigNum *this,vm_obj_id_t self,int param_2)

{
  ushort *puVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  
  puVar1 = (ushort *)(this->super_CVmObject).ext_;
  if (*puVar1 == 0) {
    iVar2 = 0;
  }
  else {
    bVar3 = 0;
    iVar2 = 0;
    uVar4 = 0;
    do {
      iVar2 = iVar2 + ((uint)(int)*(char *)((long)puVar1 + (ulong)(uVar4 >> 1) + 5) >> (~bVar3 & 4)
                      & 0xf);
      uVar4 = uVar4 + 1;
      bVar3 = bVar3 + 4;
    } while (*puVar1 != uVar4);
  }
  return (short)puVar1[1] + iVar2;
}

Assistant:

uint CVmObjBigNum::calc_hash(VMG_ vm_obj_id_t self, int /*depth*/) const
{
    uint i;
    uint hash;

    /* add up the digits in the number */
    for (hash = 0, i = 0 ; i < get_prec(ext_) ; ++i)
    {
        /* add this digit into the hash so far */
        hash += get_dig(ext_, i);
    }

    /* add in the exponent as well */
    hash += (uint)get_exp(ext_);

    /* return the combined hash */
    return hash;
}